

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall chaiscript::parser::ChaiScript_Parser::For_Guards(ChaiScript_Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  Noop_AST_Node *pNVar3;
  eval_error *peVar4;
  undefined1 local_48 [32];
  File_Position local_28;
  
  bVar2 = Equation(this);
  if (bVar2) {
    SkipWS(this,false);
    bVar2 = Eol_(this,false);
    if (!bVar2) goto LAB_001aa355;
  }
  else {
LAB_001aa355:
    SkipWS(this,false);
    bVar2 = Eol_(this,false);
    if (!bVar2) {
      peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"\'for\' loop initial statment missing","");
      local_28.line = (this->m_position).line;
      local_28.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar4,(string *)local_48,&local_28,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    pNVar3 = (Noop_AST_Node *)operator_new(0x98);
    eval::Noop_AST_Node::Noop_AST_Node(pNVar3);
    local_48._0_8_ = pNVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chaiscript::AST_Node*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8),(AST_Node *)pNVar3);
    p_Var1 = (pNVar3->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>.
             _M_weak_this.super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var1->_M_use_count == 0)) {
      (pNVar3->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
      super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pNVar3;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pNVar3->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>.
                  _M_weak_this.super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    }
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)local_48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  bVar2 = Equation(this);
  if (bVar2) {
    SkipWS(this,false);
    bVar2 = Eol_(this,false);
    if (bVar2) goto LAB_001aa48b;
  }
  SkipWS(this,false);
  bVar2 = Eol_(this,false);
  if (!bVar2) {
    peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"\'for\' loop condition missing","");
    local_28.line = (this->m_position).line;
    local_28.column = (this->m_position).col;
    exception::eval_error::eval_error
              (peVar4,(string *)local_48,&local_28,
               (this->m_filename).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  pNVar3 = (Noop_AST_Node *)operator_new(0x98);
  eval::Noop_AST_Node::Noop_AST_Node(pNVar3);
  local_48._0_8_ = pNVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chaiscript::AST_Node*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8),(AST_Node *)pNVar3);
  p_Var1 = (pNVar3->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this
           .super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (p_Var1->_M_use_count == 0)
     ) {
    (pNVar3->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pNVar3;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pNVar3->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>.
                _M_weak_this.super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  }
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
  ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
            ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
              *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
LAB_001aa48b:
  bVar2 = Equation(this);
  if (!bVar2) {
    pNVar3 = (Noop_AST_Node *)operator_new(0x98);
    eval::Noop_AST_Node::Noop_AST_Node(pNVar3);
    local_48._0_8_ = pNVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chaiscript::AST_Node*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8),(AST_Node *)pNVar3);
    p_Var1 = (pNVar3->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>.
             _M_weak_this.super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var1->_M_use_count == 0)) {
      (pNVar3->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
      super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pNVar3;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pNVar3->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>.
                  _M_weak_this.super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    }
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)local_48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  return true;
}

Assistant:

bool For_Guards() {
        if (!(Equation() && Eol()))
        {
          if (!Eol())
          {
            throw exception::eval_error("'for' loop initial statment missing", File_Position(m_position.line, m_position.col), *m_filename);
          } else {
            m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
          }
        }

        if (!(Equation() && Eol()))
        {
          if (!Eol())
          {
            throw exception::eval_error("'for' loop condition missing", File_Position(m_position.line, m_position.col), *m_filename);
          } else {
            m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
          }
        }

        if (!Equation())
        {
          m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
        }

        return true; 
      }